

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O2

size_t utf8size(void *str)

{
  char *pcVar1;
  size_t size;
  
  size = 0;
  do {
    pcVar1 = (char *)((long)str + size);
    size = size + 1;
  } while (*pcVar1 != '\0');
  return size;
}

Assistant:

size_t utf8size(const void *str) {
  const char *s = (const char *)str;
  size_t size = 0;
  while ('\0' != s[size]) {
    size++;
  }

  // we are including the null terminating byte in the size calculation
  size++;
  return size;
}